

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dim.h
# Opt level: O2

bool cnn::LooksLikeVector(Dim *d)

{
  uint *puVar1;
  bool bVar2;
  uint i;
  ulong uVar3;
  
  bVar2 = true;
  if (1 < (ulong)d->nd) {
    uVar3 = 1;
    do {
      bVar2 = d->nd == uVar3;
      if (bVar2) {
        return bVar2;
      }
      puVar1 = d->d + uVar3;
      uVar3 = uVar3 + 1;
    } while (*puVar1 == 1);
  }
  return bVar2;
}

Assistant:

inline unsigned int ndims() const { return nd; }